

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O0

void __thiscall dgrminer::PartialUnion::printAll(PartialUnion *this)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  reference paVar4;
  reference pvVar5;
  reference paVar6;
  size_type sVar7;
  reference pvVar8;
  int local_94;
  undefined1 auStack_90 [4];
  int i_1;
  array<int,_8UL> var_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *__range1_1;
  undefined1 auStack_50 [4];
  int i;
  array<int,_6UL> var;
  iterator __end1;
  iterator __begin1;
  vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_> *__range1;
  int local_18;
  bool printed_dots;
  int limit;
  int MAX_LIMIT;
  PartialUnion *this_local;
  
  local_18 = 0;
  bVar1 = false;
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "NODES (TIME, ID, LABEL, DELETED, CHANGETIME, CHANGETIMELINK):");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  __end1 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::begin
                     (&this->nodes);
  var._M_elems._16_8_ =
       std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::end(&this->nodes);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::array<int,_6UL>_*,_std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>_>
                                     *)(var._M_elems + 4)), bVar2) {
    paVar4 = __gnu_cxx::
             __normal_iterator<std::array<int,_6UL>_*,_std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>_>
             ::operator*(&__end1);
    _auStack_50 = *(undefined8 *)paVar4->_M_elems;
    var._M_elems._0_8_ = *(undefined8 *)(paVar4->_M_elems + 2);
    var._M_elems._8_8_ = *(undefined8 *)(paVar4->_M_elems + 4);
    if ((local_18 < 0x33) ||
       (sVar7 = std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::size
                          (&this->nodes), sVar7 - 0x14 <= (ulong)(long)local_18)) {
      for (__range1_1._4_4_ = 0; __range1_1._4_4_ < 6; __range1_1._4_4_ = __range1_1._4_4_ + 1) {
        pvVar5 = std::array<int,_6UL>::operator[]
                           ((array<int,_6UL> *)auStack_50,(long)__range1_1._4_4_);
        poVar3 = (ostream *)std::ostream::operator<<(&std::cout,*pvVar5);
        std::operator<<(poVar3,"\t");
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
    else if (!bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"...");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      bVar1 = true;
    }
    local_18 = local_18 + 1;
    __gnu_cxx::
    __normal_iterator<std::array<int,_6UL>_*,_std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>_>
    ::operator++(&__end1);
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  bVar1 = false;
  local_18 = 0;
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "EDGES (TIME, SRC, DST, LABEL, DIRECTION, DELETED, CHANGETIME, ID):");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  __end1_1 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::begin
                       (&this->edges);
  var_1._M_elems._24_8_ =
       std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::end(&this->edges);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::array<int,_8UL>_*,_std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
                             *)(var_1._M_elems + 6)), bVar2) {
    paVar6 = __gnu_cxx::
             __normal_iterator<std::array<int,_8UL>_*,_std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
             ::operator*(&__end1_1);
    _auStack_90 = *(undefined8 *)paVar6->_M_elems;
    var_1._M_elems._0_8_ = *(undefined8 *)(paVar6->_M_elems + 2);
    var_1._M_elems._8_8_ = *(undefined8 *)(paVar6->_M_elems + 4);
    var_1._M_elems._16_8_ = *(undefined8 *)(paVar6->_M_elems + 6);
    if ((local_18 < 0x33) ||
       (sVar7 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::size
                          (&this->edges), sVar7 - 0x14 <= (ulong)(long)local_18)) {
      for (local_94 = 0; local_94 < 8; local_94 = local_94 + 1) {
        pvVar8 = std::array<int,_8UL>::operator[]((array<int,_8UL> *)auStack_90,(long)local_94);
        poVar3 = (ostream *)std::ostream::operator<<(&std::cout,*pvVar8);
        std::operator<<(poVar3,"\t");
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
    else if (!bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"...");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      bVar1 = true;
    }
    local_18 = local_18 + 1;
    __gnu_cxx::
    __normal_iterator<std::array<int,_8UL>_*,_std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
    ::operator++(&__end1_1);
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  printEncoding(this);
  return;
}

Assistant:

void PartialUnion::printAll() {
		using namespace std;

		int MAX_LIMIT = 50;

		int limit = 0;

		bool printed_dots = false;

		cout << "NODES (TIME, ID, LABEL, DELETED, CHANGETIME, CHANGETIMELINK):" << endl;
		for (array<int, 6> var : nodes)
		{
			if (limit > MAX_LIMIT && limit < nodes.size() - 20)
			{
				if (!printed_dots)
				{
					cout << "..." << endl;
					printed_dots = true;
				}
				limit++;
				continue;
			}
			for (int i = 0; i < 6; i++)
			{
				cout << var[i] << "\t";
			}
			cout << endl;

			limit++;

		}
		cout << endl;

		printed_dots = false;
		limit = 0;

		cout << "EDGES (TIME, SRC, DST, LABEL, DIRECTION, DELETED, CHANGETIME, ID):" << endl;
		for (array<int, 8> var : edges)
		{
			if (limit > MAX_LIMIT && limit < edges.size() - 20)
			{
				if (!printed_dots)
				{
					cout << "..." << endl;
					printed_dots = true;
				}
				limit++;
				continue;
			}
			for (int i = 0; i < 8; i++)
			{
				cout << var[i] << "\t";
			}
			cout << endl;

			limit++;
		}
		cout << endl;

		printEncoding();

	}